

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O1

size_t apduCmdEnc(octet *apdu,apdu_cmd_t *cmd)

{
  ulong uVar1;
  octet *poVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  
  if (apdu == (octet *)0x0) {
    poVar2 = (octet *)0x0;
  }
  else {
    *apdu = cmd->cla;
    apdu[1] = cmd->ins;
    apdu[2] = cmd->p1;
    apdu[3] = cmd->p2;
    poVar2 = apdu + 4;
  }
  uVar1 = cmd->cdf_len;
  if (uVar1 == 0) {
    sVar5 = 4;
    goto LAB_00117b9d;
  }
  if ((uVar1 < 0x100) && (cmd->rdf_len < 0x101)) {
    if (poVar2 != (octet *)0x0) {
      *poVar2 = (octet)uVar1;
      lVar4 = 5;
      lVar3 = 1;
      goto LAB_00117b67;
    }
    lVar4 = 5;
LAB_00117b97:
    poVar2 = (octet *)0x0;
  }
  else {
    if (poVar2 == (octet *)0x0) {
      lVar4 = 7;
      goto LAB_00117b97;
    }
    *poVar2 = '\0';
    poVar2[1] = *(octet *)((long)&cmd->cdf_len + 1);
    poVar2[2] = (octet)cmd->cdf_len;
    lVar4 = 7;
    lVar3 = 3;
LAB_00117b67:
    memCopy(poVar2 + lVar3,cmd + 1,cmd->cdf_len);
    poVar2 = poVar2 + lVar3 + cmd->cdf_len;
  }
  sVar5 = lVar4 + cmd->cdf_len;
LAB_00117b9d:
  uVar1 = cmd->rdf_len;
  if (uVar1 != 0) {
    if ((uVar1 < 0x101) && (cmd->cdf_len < 0x100)) {
      if (poVar2 != (octet *)0x0) {
        *poVar2 = (octet)uVar1;
      }
      sVar5 = sVar5 + 1;
    }
    else if (cmd->cdf_len == 0) {
      if (poVar2 != (octet *)0x0) {
        *poVar2 = '\0';
        poVar2[1] = *(octet *)((long)&cmd->rdf_len + 1);
        poVar2[2] = (octet)cmd->rdf_len;
      }
      sVar5 = sVar5 + 3;
    }
    else {
      if (poVar2 != (octet *)0x0) {
        *poVar2 = (octet)(uVar1 >> 8);
        poVar2[1] = (octet)cmd->rdf_len;
      }
      sVar5 = sVar5 + 2;
    }
  }
  return sVar5;
}

Assistant:

size_t apduCmdEnc(octet apdu[], const apdu_cmd_t* cmd)
{
	size_t count;
	// pre
	ASSERT(apduCmdIsValid(cmd));
	// кодировать заголовок
	if (apdu)
	{
		ASSERT(memIsDisjoint2(apdu, 4, cmd, apduCmdSizeof(cmd)));
		apdu[0] = cmd->cla, apdu[1] = cmd->ins;
		apdu[2] = cmd->p1, apdu[3] = cmd->p2;
		apdu += 4;
	}
	count = 4;
	// кодировать [cdf_len]cdf: пустая форма
	if (cmd->cdf_len == 0)
		count += 0 + cmd->cdf_len;
	// кодировать [cdf_len]cdf: короткая форма
	else if (cmd->cdf_len < 256 && cmd->rdf_len <= 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->cdf_len;
			memCopy(apdu + 1, cmd->cdf, cmd->cdf_len);
			apdu += 1 + cmd->cdf_len;
		}
		count += 1 + cmd->cdf_len;
	}
	// кодировать [cdf_len]cdf: длинная форма
	else
	{
		ASSERT(cmd->cdf_len < 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->cdf_len / 256);
			apdu[2] = (octet)cmd->cdf_len;
			memCopy(apdu + 3, cmd->cdf, cmd->cdf_len);
			apdu += 3 + cmd->cdf_len;
		}
		count += 3 + cmd->cdf_len;
	}
	// кодировать rdf_len: пустая форма
	if (cmd->rdf_len == 0)
		count += 0;
	// кодировать rdf_len: короткая форма
	else if (cmd->rdf_len <= 256 && cmd->cdf_len < 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->rdf_len;
		}
		count += 1;
	}
	// кодировать rdf_len: длинная форма, 2 октета
	else if (cmd->cdf_len)
	{ 
		ASSERT(256 <= cmd->cdf_len || 256 < cmd->rdf_len);
		ASSERT(cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 2, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)(cmd->rdf_len / 256);
			apdu[1] = (octet)cmd->rdf_len;
		}
		count += 2;
	}
	else
	{
		ASSERT(256 < cmd->rdf_len && cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->rdf_len / 256);
			apdu[2] = (octet)cmd->rdf_len;
		}
		count += 3;
	}
	// возвратить длину кода
	return count;
}